

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void concept_const_suite::random_access_iterator_difference(void)

{
  initializer_list<int> __l;
  undefined4 local_9c;
  difference_type local_98;
  const_iterator local_90;
  const_iterator local_80;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> alpha;
  circular_view<int,_18446744073709551615UL> bravo;
  
  alpha.member.data = (pointer)0x160000000b;
  alpha.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&alpha;
  std::vector<int,_std::allocator<int>_>::vector(&data,__l,(allocator_type *)&bravo);
  alpha.member.data = (pointer)0x0;
  if ((long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    alpha.member.data =
         data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
  }
  alpha.member.cap =
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  bravo.member.size = alpha.member.cap - 1;
  alpha.member.size = alpha.member.cap;
  alpha.member.next = alpha.member.cap;
  bravo.member.data = alpha.member.data;
  bravo.member.cap = alpha.member.cap;
  bravo.member.next = alpha.member.cap;
  local_80 = vista::circular_view<int,_18446744073709551615UL>::begin(&alpha);
  local_90 = vista::circular_view<int,_18446744073709551615UL>::begin(&bravo);
  local_98 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator-
                       (&local_80,&local_90);
  local_9c = 0xffffffff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("alpha.begin() - bravo.begin()","-1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x201,"void concept_const_suite::random_access_iterator_difference()",&local_98,
             &local_9c);
  local_80 = vista::circular_view<int,_18446744073709551615UL>::begin(&bravo);
  local_90 = vista::circular_view<int,_18446744073709551615UL>::begin(&alpha);
  local_98 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator-
                       (&local_80,&local_90);
  local_9c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("bravo.begin() - alpha.begin()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x202,"void concept_const_suite::random_access_iterator_difference()",&local_98,
             &local_9c);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void random_access_iterator_difference()
{
    // b - a
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> alpha(data.begin(), data.end(), data.begin(), data.size());
    const circular_view<int> bravo(data.begin(), data.end(), std::next(data.begin()), data.size() - 1);
    BOOST_TEST_EQ(alpha.begin() - bravo.begin(), -1);
    BOOST_TEST_EQ(bravo.begin() - alpha.begin(), 1);
}